

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdbusmenuadaptor_p.cpp
# Opt level: O3

void __thiscall
QDBusMenuAdaptor::qt_static_metacall(QDBusMenuAdaptor *this,QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  QArrayData *pQVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  uint uVar6;
  undefined8 *puVar7;
  undefined4 in_register_0000000c;
  long *plVar8;
  InterfaceType *pIVar9;
  longlong lVar10;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_38;
  undefined1 *puStack_20;
  QDBusVariant *local_18;
  
  plVar8 = (long *)CONCAT44(in_register_0000000c,_id);
  local_18 = *(QDBusVariant **)(in_FS_OFFSET + 0x28);
  switch((ulong)_o & 0xffffffff) {
  case 0:
    switch(_c) {
    case InvokeMetaMethod:
      if (*(QDBusVariant **)(in_FS_OFFSET + 0x28) == local_18) {
        ItemActivationRequested(this,*(int *)plVar8[1],*(uint *)plVar8[2]);
        return;
      }
      goto LAB_00630fc8;
    case ReadProperty:
      local_38.shared = (PrivateShared *)0x0;
      local_38._8_8_ = plVar8[1];
      local_38._16_8_ = plVar8[2];
      QMetaObject::activate((QObject *)this,&staticMetaObject,1,&local_38.shared);
      break;
    case WriteProperty:
      if (*(QDBusVariant **)(in_FS_OFFSET + 0x28) == local_18) {
        LayoutUpdated(this,*(uint *)plVar8[1],*(int *)plVar8[2]);
        return;
      }
      goto LAB_00630fc8;
    case ResetProperty:
      AboutToShow(this,*(int *)plVar8[1]);
      if ((undefined1 *)*plVar8 != (undefined1 *)0x0) {
        *(undefined1 *)*plVar8 = 0;
      }
      break;
    case CreateInstance:
      local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      AboutToShowGroup((QList<int> *)&local_38,this,(QList<int> *)plVar8[1],(QList<int> *)plVar8[2])
      ;
      goto LAB_00630f42;
    case IndexOfMethod:
      if (*(QDBusVariant **)(in_FS_OFFSET + 0x28) == local_18) {
        Event(this,*(int *)plVar8[1],(QString *)plVar8[2],*(QDBusVariant **)(in_FS_OFFSET + 0x28),
              (uint)_a);
        return;
      }
      goto LAB_00630fc8;
    case RegisterPropertyMetaType:
      local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      EventGroup((QList<int> *)&local_38,this,(QDBusMenuEventList *)plVar8[1]);
LAB_00630f42:
      if ((QArrayDataPointer<int> *)*plVar8 != (QArrayDataPointer<int> *)0x0) {
        QArrayDataPointer<int>::operator=
                  ((QArrayDataPointer<int> *)*plVar8,(QArrayDataPointer<int> *)&local_38);
      }
      if ((QArrayData *)local_38.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_38.shared = *(int *)local_38.shared + -1;
        UNLOCK();
        if (*(int *)local_38.shared == 0) {
          lVar10 = 4;
LAB_00630f69:
          QArrayData::deallocate((QArrayData *)local_38.shared,lVar10,0x10);
        }
      }
      break;
    case RegisterMethodArgumentMetaType:
      local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      GetGroupProperties((QDBusMenuItemList *)&local_38,
                         (QDBusMenuAdaptor *)&switchD_00630bed::switchdataD_006c8cd0,
                         (QList<int> *)plVar8[1],(QStringList *)plVar8[2]);
      if ((QArrayDataPointer<QDBusMenuItem> *)*plVar8 != (QArrayDataPointer<QDBusMenuItem> *)0x0) {
        QArrayDataPointer<QDBusMenuItem>::operator=
                  ((QArrayDataPointer<QDBusMenuItem> *)*plVar8,
                   (QArrayDataPointer<QDBusMenuItem> *)&local_38);
      }
      QArrayDataPointer<QDBusMenuItem>::~QArrayDataPointer
                ((QArrayDataPointer<QDBusMenuItem> *)&local_38);
      break;
    case BindableProperty:
      uVar6 = GetLayout(this,*(int *)plVar8[1],*(int *)plVar8[2],(QStringList *)plVar8[3],
                        (QDBusMenuLayoutItem *)plVar8[4]);
      if ((uint *)*plVar8 != (uint *)0x0) {
        *(uint *)*plVar8 = uVar6;
      }
      break;
    case CustomCall:
      local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_38.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      GetProperty((QDBusVariant *)&local_38,
                  (QDBusMenuAdaptor *)&switchD_00630bed::switchdataD_006c8cd0,*(int *)plVar8[1],
                  (QString *)plVar8[2]);
      if ((QVariant *)*plVar8 != (QVariant *)0x0) {
        ::QVariant::operator=((QVariant *)*plVar8,(QVariant *)&local_38);
      }
      ::QVariant::~QVariant((QVariant *)&local_38);
    }
    break;
  case 1:
    puVar7 = (undefined8 *)*plVar8;
    if (_c == WriteProperty) {
      *(undefined4 *)puVar7 = 4;
      break;
    }
    if (_c == ReadProperty) {
      textDirection((QString *)&local_38,(QDBusMenuAdaptor *)&switchD_00630bed::switchdataD_006c8cd0
                   );
    }
    else {
      if (_c != InvokeMetaMethod) break;
      status((QString *)&local_38,(QDBusMenuAdaptor *)&switchD_00630bed::switchdataD_006c8cd0);
    }
    pQVar3 = (QArrayData *)*puVar7;
    puVar4 = (undefined1 *)puVar7[1];
    *puVar7 = local_38.shared;
    puVar7[1] = local_38._8_8_;
    puVar5 = (undefined1 *)puVar7[2];
    puVar7[2] = local_38._16_8_;
    local_38.shared = (PrivateShared *)pQVar3;
    local_38._8_8_ = puVar4;
    local_38._16_8_ = puVar5;
    if (pQVar3 == (QArrayData *)0x0) break;
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i != 0) break;
    lVar10 = 2;
    goto LAB_00630f69;
  case 5:
    pcVar1 = *(code **)plVar8[1];
    lVar2 = ((long *)plVar8[1])[1];
    if (pcVar1 == ItemActivationRequested && lVar2 == 0) {
      *(undefined4 *)*plVar8 = 0;
    }
    else if (pcVar1 == ItemsPropertiesUpdated && lVar2 == 0) {
      *(undefined4 *)*plVar8 = 1;
    }
    else if (pcVar1 == LayoutUpdated && lVar2 == 0) {
      *(undefined4 *)*plVar8 = 2;
    }
    break;
  case 7:
    switch(_c) {
    case ReadProperty:
      puVar7 = (undefined8 *)*plVar8;
      if (*(int *)plVar8[1] == 0) {
        pIVar9 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QDBusMenuItem>_>::metaType;
      }
      else {
        if (*(int *)plVar8[1] != 1) goto LAB_00630db4;
        pIVar9 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QDBusMenuItemKeys>_>::metaType;
      }
      break;
    default:
      puVar7 = (undefined8 *)*plVar8;
LAB_00630db4:
      *puVar7 = 0;
      goto switchD_00630bed_caseD_2;
    case CreateInstance:
    case RegisterMethodArgumentMetaType:
      puVar7 = (undefined8 *)*plVar8;
      if (*(int *)plVar8[1] != 0) goto LAB_00630db4;
      pIVar9 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<int>_>::metaType;
      break;
    case IndexOfMethod:
      puVar7 = (undefined8 *)*plVar8;
      if (*(int *)plVar8[1] != 2) goto LAB_00630db4;
      pIVar9 = &QtPrivate::QMetaTypeInterfaceWrapper<QDBusVariant>::metaType;
      break;
    case RegisterPropertyMetaType:
      puVar7 = (undefined8 *)*plVar8;
      if (*(int *)plVar8[1] != 0) goto LAB_00630db4;
      pIVar9 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QDBusMenuEvent>_>::metaType;
    }
    *puVar7 = pIVar9;
  }
switchD_00630bed_caseD_2:
  if (*(QDBusVariant **)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_00630fc8:
  __stack_chk_fail();
}

Assistant:

void QDBusMenuAdaptor::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDBusMenuAdaptor *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->ItemActivationRequested((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<uint>>(_a[2]))); break;
        case 1: _t->ItemsPropertiesUpdated((*reinterpret_cast< std::add_pointer_t<QDBusMenuItemList>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QDBusMenuItemKeysList>>(_a[2]))); break;
        case 2: _t->LayoutUpdated((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 3: { bool _r = _t->AboutToShow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 4: { QList<int> _r = _t->AboutToShowGroup((*reinterpret_cast< std::add_pointer_t<QList<int>>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QList<int>&>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QList<int>*>(_a[0]) = std::move(_r); }  break;
        case 5: _t->Event((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QDBusVariant>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<uint>>(_a[4]))); break;
        case 6: { QList<int> _r = _t->EventGroup((*reinterpret_cast< std::add_pointer_t<QDBusMenuEventList>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QList<int>*>(_a[0]) = std::move(_r); }  break;
        case 7: { QDBusMenuItemList _r = _t->GetGroupProperties((*reinterpret_cast< std::add_pointer_t<QList<int>>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QStringList>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QDBusMenuItemList*>(_a[0]) = std::move(_r); }  break;
        case 8: { uint _r = _t->GetLayout((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QStringList>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QDBusMenuLayoutItem&>>(_a[4])));
            if (_a[0]) *reinterpret_cast< uint*>(_a[0]) = std::move(_r); }  break;
        case 9: { QDBusVariant _r = _t->GetProperty((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QDBusVariant*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusMenuItemKeysList >(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusMenuItemList >(); break;
            }
            break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<int> >(); break;
            }
            break;
        case 5:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 2:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusVariant >(); break;
            }
            break;
        case 6:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusMenuEventList >(); break;
            }
            break;
        case 7:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<int> >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDBusMenuAdaptor::*)(int , uint )>(_a, &QDBusMenuAdaptor::ItemActivationRequested, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDBusMenuAdaptor::*)(const QDBusMenuItemList & , const QDBusMenuItemKeysList & )>(_a, &QDBusMenuAdaptor::ItemsPropertiesUpdated, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDBusMenuAdaptor::*)(uint , int )>(_a, &QDBusMenuAdaptor::LayoutUpdated, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->status(); break;
        case 1: *reinterpret_cast<QString*>(_v) = _t->textDirection(); break;
        case 2: *reinterpret_cast<uint*>(_v) = _t->version(); break;
        default: break;
        }
    }
}